

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSaveFileLineEdit.cpp
# Opt level: O1

void QSaveFileLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QStringList *filter;
  ActionPosition *pAVar1;
  code *pcVar2;
  long lVar3;
  undefined8 uVar4;
  Data *pDVar5;
  QString *pQVar6;
  qsizetype qVar7;
  Options OVar8;
  int iVar9;
  QArrayDataPointer<QString> local_48;
  QArrayDataPointer<QString> local_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      local_48.ptr = (QString *)_a[1];
      iVar9 = 1;
    }
    else {
      if (_id != 0) {
        return;
      }
      local_48.ptr = (QString *)&local_28;
      local_28.d = (Data *)CONCAT44(local_28.d._4_4_,*_a[1]);
      iVar9 = 0;
    }
    local_48.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar9,&local_48.d);
    break;
  case ReadProperty:
    if (5 < (uint)_id) {
      return;
    }
    pAVar1 = (ActionPosition *)*_a;
    switch(_id) {
    case 0:
      OVar8.i = embededActionPosition((QSaveFileLineEdit *)_o);
      goto LAB_00168d13;
    case 1:
      filePath((QString *)&local_48,(QSaveFileLineEdit *)_o);
      break;
    case 2:
      caption((QString *)&local_48,(QSaveFileLineEdit *)_o);
      break;
    case 3:
      directory((QString *)&local_48,(QSaveFileLineEdit *)_o);
      break;
    case 4:
      QSaveFileLineEdit::filter((QStringList *)&local_28,(QSaveFileLineEdit *)_o);
      qVar7 = local_28.size;
      pQVar6 = local_28.ptr;
      pDVar5 = local_28.d;
      local_28.d = (Data *)0x0;
      local_28.ptr = (QString *)0x0;
      local_28.size = 0;
      local_48.d = *(Data **)pAVar1;
      local_48.ptr = *(QString **)(pAVar1 + 2);
      *(Data **)pAVar1 = pDVar5;
      *(QString **)(pAVar1 + 2) = pQVar6;
      local_48.size = *(qsizetype *)(pAVar1 + 4);
      *(qsizetype *)(pAVar1 + 4) = qVar7;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_28);
      return;
    case 5:
      OVar8 = options((QSaveFileLineEdit *)_o);
LAB_00168d13:
      *pAVar1 = OVar8.i;
      return;
    }
    pDVar5 = *(Data **)pAVar1;
    pQVar6 = *(QString **)(pAVar1 + 2);
    *(Data **)pAVar1 = local_48.d;
    *(QString **)(pAVar1 + 2) = local_48.ptr;
    uVar4 = *(undefined8 *)(pAVar1 + 4);
    *(qsizetype *)(pAVar1 + 4) = local_48.size;
    local_48.d = pDVar5;
    local_48.ptr = pQVar6;
    local_48.size = uVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    break;
  case WriteProperty:
    if ((uint)_id < 6) {
      filter = (QStringList *)*_a;
      switch(_id) {
      case 0:
        setEmbededActionPosition((QSaveFileLineEdit *)_o,*(ActionPosition *)&(filter->d).d);
        return;
      case 1:
        setFilePath((QSaveFileLineEdit *)_o,(QString *)filter);
        return;
      case 2:
        setCaption((QSaveFileLineEdit *)_o,(QString *)filter);
        return;
      case 3:
        setDirectory((QSaveFileLineEdit *)_o,(QString *)filter);
        return;
      case 4:
        setFilter((QSaveFileLineEdit *)_o,filter);
        return;
      case 5:
        setOptions((QSaveFileLineEdit *)_o,(Options)*(Int *)&(filter->d).d);
        return;
      }
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == embededActionPositionChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == filePathChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  return;
}

Assistant:

void QSaveFileLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QSaveFileLineEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->embededActionPositionChanged((*reinterpret_cast< std::add_pointer_t<QLineEdit::ActionPosition>>(_a[1]))); break;
        case 1: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QSaveFileLineEdit::*)(QLineEdit::ActionPosition );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSaveFileLineEdit::embededActionPositionChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QSaveFileLineEdit::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QSaveFileLineEdit::filePathChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QSaveFileLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QLineEdit::ActionPosition*>(_v) = _t->embededActionPosition(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 3: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 4: *reinterpret_cast< QStringList*>(_v) = _t->filter(); break;
        case 5: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QSaveFileLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEmbededActionPosition(*reinterpret_cast< QLineEdit::ActionPosition*>(_v)); break;
        case 1: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setFilter(*reinterpret_cast< QStringList*>(_v)); break;
        case 5: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}